

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

void __thiscall soinn::ESOINN::deleteNoiseVertex(ESOINN *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  _List_node_base *u;
  long lVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  AdjList *g;
  double dVar5;
  
  p_Var2 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
LAB_00132594:
  p_Var4 = p_Var2;
  if (p_Var4 == (_List_node_base *)&(this->graph).super_type.m_vertices) {
    return;
  }
  p_Var2 = p_Var4->_M_next;
  u = p_Var4[1]._M_next;
  dVar5 = meanDensity(this,*(int *)((long)(u + 3) + 8));
  lVar3 = (long)u[1]._M_next;
  if (lVar3 != 0) {
    if (lVar3 != 1) goto code_r0x001325bf;
    dVar1 = this->c2;
    goto LAB_001325d1;
  }
  goto LAB_001325d9;
code_r0x001325bf:
  if (lVar3 == 2) {
    dVar1 = this->c1;
LAB_001325d1:
    if ((double)u[4]._M_next <= dVar5 * dVar1 && dVar5 * dVar1 != (double)u[4]._M_next) {
LAB_001325d9:
      boost::
      clear_vertex<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>
                (u,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>
                    *)&this->graph);
      boost::
      remove_vertex<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                (p_Var4[1]._M_next,&(this->graph).super_type);
    }
  }
  goto LAB_00132594;
}

Assistant:

void ESOINN::deleteNoiseVertex()
{
    VertexIterator begin, end;
    boost::tie(begin, end) = boost::vertices(graph);
    VertexIterator next = begin;
    for(VertexIterator current = begin; current != end; current = next)
    {
        next++;
        double mean = meanDensity(graph[*current].classId);
        if((boost::out_degree(*current, graph) == 2 && graph[*current].density < c1* mean) ||
                (boost::out_degree(*current, graph) == 1 && graph[*current].density < c2* mean) ||
                (boost::out_degree(*current, graph) == 0)) {
            boost::clear_vertex(*current, graph);
            boost::remove_vertex(*current, graph);
        }
    }
}